

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::EndInitExpr(BinaryReaderInterp *this)

{
  pointer *ppLVar1;
  Result RVar2;
  
  FixupMap::Resolve(&this->depth_fixups_,this->istream_,
                    (int)((ulong)((long)(this->label_stack_).
                                        super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->label_stack_).
                                       super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1);
  RVar2 = SharedValidator::EndInitExpr(&this->validator_);
  if (RVar2.enum_ != Error) {
    Istream::Emit(this->istream_,Return);
    ppLVar1 = &(this->label_stack_).
               super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar1 = *ppLVar1 + -1;
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::EndInitExpr() {
  FixupTopLabel();
  CHECK_RESULT(validator_.EndInitExpr());
  istream_.Emit(Opcode::Return);
  PopLabel();
  return Result::Ok;
}